

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

void flatcc_json_printer_union_field
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,flatcc_json_printer_union_type_f *ptf,
               flatcc_json_printer_union_f *pf)

{
  char *pcVar1;
  int iVar2;
  void *p_00;
  void *pvVar3;
  undefined1 local_60 [8];
  flatcc_json_printer_union_descriptor_t ud;
  flatbuffers_utype_t type;
  void *p;
  void *pt;
  flatcc_json_printer_union_type_f *ptf_local;
  size_t len_local;
  char *name_local;
  int id_local;
  flatcc_json_printer_table_descriptor_t *td_local;
  flatcc_json_printer_t *ctx_local;
  
  p_00 = get_field_ptr(td,id + -1);
  pvVar3 = get_field_ptr(td,id);
  if ((pvVar3 != (void *)0x0) && (p_00 != (void *)0x0)) {
    ud._15_1_ = __flatbuffers_utype_read_from_pe(p_00);
    iVar2 = td->count;
    td->count = iVar2 + 1;
    if (iVar2 != 0) {
      pcVar1 = ctx->p;
      ctx->p = pcVar1 + 1;
      *pcVar1 = ',';
    }
    if (ctx->indent == '\0') {
      flatcc_json_printer_flush_partial(ctx);
    }
    else {
      pcVar1 = ctx->p;
      ctx->p = pcVar1 + 1;
      *pcVar1 = '\n';
      print_indent(ctx);
    }
    *ctx->p = '\"';
    ctx->p = ctx->p + (int)(uint)((ctx->unquote != '\0' ^ 0xffU) & 1);
    if (ctx->p + len < ctx->pflush) {
      memcpy(ctx->p,name,len);
      ctx->p = ctx->p + len;
    }
    else {
      print(ctx,name,len);
    }
    print(ctx,"_type",5);
    *ctx->p = '\"';
    ctx->p = ctx->p + (int)(uint)((ctx->unquote != '\0' ^ 0xffU) & 1);
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = ':';
    *ctx->p = ' ';
    ctx->p = ctx->p + (int)(uint)(ctx->indent != '\0');
    if (ctx->noenum == '\0') {
      (*ptf)(ctx,ud._15_1_);
    }
    else {
      iVar2 = print_uint8(ud._15_1_,ctx->p);
      ctx->p = ctx->p + iVar2;
    }
    if (ud._15_1_ != '\0') {
      pcVar1 = ctx->p;
      ctx->p = pcVar1 + 1;
      *pcVar1 = ',';
      print_name(ctx,name,len);
      ud.member._0_4_ = td->ttl;
      ud.member._4_1_ = ud._15_1_;
      local_60 = (undefined1  [8])pvVar3;
      (*pf)(ctx,(flatcc_json_printer_union_descriptor_t *)local_60);
    }
  }
  return;
}

Assistant:

void flatcc_json_printer_union_field(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len,
        flatcc_json_printer_union_type_f ptf,
        flatcc_json_printer_union_f pf)
{
    const void *pt = get_field_ptr(td, id - 1);
    const void *p = get_field_ptr(td, id);
    utype_t type;
    flatcc_json_printer_union_descriptor_t ud;

    if (!p || !pt) {
        return;
    }
    type = __flatbuffers_utype_read_from_pe(pt);
    if (td->count++) {
        print_char(',');
    }
    print_nl();
    *ctx->p = '\"';
    ctx->p += !ctx->unquote;
    if (ctx->p + len < ctx->pflush) {
        memcpy(ctx->p, name, len);
        ctx->p += len;
    } else {
        print(ctx, name, len);
    }
    print(ctx, "_type", 5);
    *ctx->p = '\"';
    ctx->p += !ctx->unquote;
    print_char(':');
    print_space();
    if (ctx->noenum) {
        ctx->p += print_utype(type, ctx->p);
    } else {
        ptf(ctx, type);
    }
    if (type != 0) {
        print_char(',');
        print_name(ctx, name, len);
        ud.ttl = td->ttl;
        ud.type = type;
        ud.member = p;
        pf(ctx, &ud);
    }
}